

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter_Geometry3D.cpp
# Opt level: O2

void __thiscall Assimp::X3DImporter::ParseNode_Geometry3D_Cylinder(X3DImporter *this)

{
  FIReader *pFVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  CX3DImporter_NodeElement_Geometry3D *this_00;
  string *psVar5;
  int pAttrIdx;
  ulong uVar6;
  CX3DImporter_NodeElement *pCVar7;
  value_type *__x;
  pointer paVar8;
  float fVar9;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  bool local_ec;
  bool local_eb;
  bool local_ea;
  bool local_e9;
  CX3DImporter_NodeElement *ne;
  float local_e0;
  allocator local_d9;
  undefined8 local_d8;
  undefined8 uStack_d0;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> tcir;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> tside;
  string def;
  string use;
  string an;
  
  use._M_dataplus._M_p = (pointer)&use.field_2;
  use._M_string_length = 0;
  def._M_dataplus._M_p = (pointer)&def.field_2;
  def._M_string_length = 0;
  uVar6 = 0;
  ne = (CX3DImporter_NodeElement *)0x0;
  use.field_2._M_local_buf[0] = '\0';
  def.field_2._M_local_buf[0] = '\0';
  iVar3 = (*(((this->mReader)._M_t.
              super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
              super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
              super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
            super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[4])();
  if (iVar3 < 1) {
    iVar3 = 0;
  }
  local_d8 = 0x40000000;
  uStack_d0 = 0;
  local_e0 = 1.0;
  local_ec = true;
  local_e9 = true;
  local_eb = true;
  local_ea = true;
  do {
    pAttrIdx = (int)uVar6;
    if (iVar3 == pAttrIdx) {
      if (use._M_string_length == 0) {
        tside.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        tside.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        tside.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        tcir.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        tcir.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        tcir.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        this_00 = (CX3DImporter_NodeElement_Geometry3D *)operator_new(0x78);
        CX3DImporter_NodeElement_Geometry3D::CX3DImporter_NodeElement_Geometry3D
                  (this_00,ENET_Cylinder,this->NodeElement_Cur);
        ne = (CX3DImporter_NodeElement *)this_00;
        if (def._M_string_length != 0) {
          std::__cxx11::string::_M_assign((string *)&(this_00->super_CX3DImporter_NodeElement).ID);
        }
        if (local_ec != false) {
          StandardShapes::MakeCone((ai_real)local_d8,local_e0,local_e0,0x1e,&tside,true);
        }
        if ((local_eb != false) || (local_ea != false)) {
          StandardShapes::MakeCircle(local_e0,0x1e,&tcir);
        }
        local_d8 = CONCAT44(local_d8._4_4_,(ai_real)local_d8 * 0.5);
        pCVar7 = ne + 1;
        for (paVar8 = tside.
                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            paVar8 != tside.
                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_finish; paVar8 = paVar8 + 1) {
          std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                    ((list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)pCVar7,paVar8);
        }
        __x = tcir.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
        if (local_eb != false) {
          for (; __x != tcir.
                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_finish; __x = __x + 1) {
            __x->y = (ai_real)local_d8;
            std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                      ((list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)pCVar7,__x);
          }
        }
        if (local_ea != false) {
          local_d8 = local_d8 ^ 0x8000000080000000;
          uStack_d0 = uStack_d0 ^ 0x8000000080000000;
          for (paVar8 = tcir.
                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_start;
              paVar8 != tcir.
                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_finish; paVar8 = paVar8 + 1) {
            paVar8->y = (ai_real)local_d8;
            std::__cxx11::list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                      ((list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)pCVar7,paVar8
                      );
          }
        }
        ne[1].ID.field_2._M_local_buf[0] = local_e9;
        ne[1].ID._M_string_length = 3;
        iVar3 = (*(((this->mReader)._M_t.
                    super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                    .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                  super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xf])();
        pCVar7 = ne;
        if ((char)iVar3 == '\0') {
          std::__cxx11::string::string((string *)&an,"Cylinder",&local_d9);
          ParseNode_Metadata(this,pCVar7,&an);
          std::__cxx11::string::~string((string *)&an);
        }
        else {
          std::__cxx11::
          list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::push_back
                    (&this->NodeElement_Cur->Child,&ne);
        }
        std::__cxx11::list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
        ::push_back(&this->NodeElement_List,&ne);
        std::_Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~_Vector_base
                  (&tcir.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)
        ;
        std::_Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~_Vector_base
                  (&tside.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                  );
      }
      else {
        XML_CheckNode_MustBeEmpty(this);
        if (def._M_string_length != 0) {
          Throw_DEF_And_USE(this);
        }
        bVar2 = FindNodeElement(this,&use,ENET_Cylinder,&ne);
        if (!bVar2) {
          Throw_USE_NotFound(this,&use);
        }
        std::__cxx11::list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
        ::push_back(&this->NodeElement_Cur->Child,&ne);
      }
      std::__cxx11::string::~string((string *)&def);
      std::__cxx11::string::~string((string *)&use);
      return;
    }
    pFVar1 = (this->mReader)._M_t.
             super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
             super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
             super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl;
    iVar4 = (*(pFVar1->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[5])
                      (pFVar1,uVar6);
    std::__cxx11::string::string
              ((string *)&an,(char *)CONCAT44(extraout_var,iVar4),(allocator *)&tside);
    bVar2 = std::operator==(&an,"DEF");
    if (bVar2) {
      pFVar1 = (this->mReader)._M_t.
               super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
               super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
               super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl;
      (*(pFVar1->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])(pFVar1,uVar6)
      ;
      psVar5 = &def;
LAB_0057aeab:
      std::__cxx11::string::assign((char *)psVar5);
    }
    else {
      bVar2 = std::operator==(&an,"USE");
      if (bVar2) {
        pFVar1 = (this->mReader)._M_t.
                 super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
                 super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl;
        (*(pFVar1->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])
                  (pFVar1,uVar6);
        psVar5 = &use;
        goto LAB_0057aeab;
      }
      bVar2 = std::operator==(&an,"bboxCenter");
      if (((!bVar2) && (bVar2 = std::operator==(&an,"bboxSize"), !bVar2)) &&
         (bVar2 = std::operator==(&an,"containerField"), !bVar2)) {
        bVar2 = std::operator==(&an,"radius");
        if (bVar2) {
          local_e0 = XML_ReadNode_GetAttrVal_AsFloat(this,pAttrIdx);
        }
        else {
          bVar2 = std::operator==(&an,"solid");
          if (bVar2) {
            local_e9 = XML_ReadNode_GetAttrVal_AsBool(this,pAttrIdx);
          }
          else {
            bVar2 = std::operator==(&an,"bottom");
            if (bVar2) {
              local_ea = XML_ReadNode_GetAttrVal_AsBool(this,pAttrIdx);
            }
            else {
              bVar2 = std::operator==(&an,"top");
              if (bVar2) {
                local_eb = XML_ReadNode_GetAttrVal_AsBool(this,pAttrIdx);
              }
              else {
                bVar2 = std::operator==(&an,"side");
                if (bVar2) {
                  local_ec = XML_ReadNode_GetAttrVal_AsBool(this,pAttrIdx);
                }
                else {
                  bVar2 = std::operator==(&an,"height");
                  if (bVar2) {
                    fVar9 = XML_ReadNode_GetAttrVal_AsFloat(this,pAttrIdx);
                    local_d8 = CONCAT44(extraout_XMM0_Db,fVar9);
                    uStack_d0 = CONCAT44(extraout_XMM0_Dd,extraout_XMM0_Dc);
                  }
                  else {
                    Throw_IncorrectAttr(this,&an);
                  }
                }
              }
            }
          }
        }
      }
    }
    std::__cxx11::string::~string((string *)&an);
    uVar6 = (ulong)(pAttrIdx + 1);
  } while( true );
}

Assistant:

void X3DImporter::ParseNode_Geometry3D_Cylinder()
{
    std::string use, def;
    bool bottom = true;
    float height = 2;
    float radius = 1;
    bool side = true;
    bool solid = true;
    bool top = true;
    CX3DImporter_NodeElement* ne( nullptr );

	MACRO_ATTRREAD_LOOPBEG;
		MACRO_ATTRREAD_CHECKUSEDEF_RET(def, use);
		MACRO_ATTRREAD_CHECK_RET("radius", radius, XML_ReadNode_GetAttrVal_AsFloat);
		MACRO_ATTRREAD_CHECK_RET("solid", solid, XML_ReadNode_GetAttrVal_AsBool);
		MACRO_ATTRREAD_CHECK_RET("bottom", bottom, XML_ReadNode_GetAttrVal_AsBool);
		MACRO_ATTRREAD_CHECK_RET("top", top, XML_ReadNode_GetAttrVal_AsBool);
		MACRO_ATTRREAD_CHECK_RET("side", side, XML_ReadNode_GetAttrVal_AsBool);
		MACRO_ATTRREAD_CHECK_RET("height", height, XML_ReadNode_GetAttrVal_AsFloat);
	MACRO_ATTRREAD_LOOPEND;

	// if "USE" defined then find already defined element.
	if(!use.empty())
	{
		MACRO_USE_CHECKANDAPPLY(def, use, ENET_Cylinder, ne);
	}
	else
	{
		const unsigned int tess = 30;///TODO: IME tessellation factor through ai_property

		std::vector<aiVector3D> tside;// temp array for vertices of side.
		std::vector<aiVector3D> tcir;// temp array for vertices of circle.

		// create and if needed - define new geometry object.
		ne = new CX3DImporter_NodeElement_Geometry3D(CX3DImporter_NodeElement::ENET_Cylinder, NodeElement_Cur);
		if(!def.empty()) ne->ID = def;

		// make cilynder or parts according to flags.
		if(side) StandardShapes::MakeCone(height, radius, radius, tess, tside, true);

		height /= 2;// height defined for whole cylinder, when creating top and bottom circle we are using just half of height.
		if(top || bottom) StandardShapes::MakeCircle(radius, tess, tcir);
		// copy data from temp arrays
		std::list<aiVector3D>& vlist = ((CX3DImporter_NodeElement_Geometry3D*)ne)->Vertices;// just short alias.

		for(std::vector<aiVector3D>::iterator it = tside.begin(); it != tside.end(); ++it) vlist.push_back(*it);

		if(top)
		{
			for(std::vector<aiVector3D>::iterator it = tcir.begin(); it != tcir.end(); ++it)
			{
				(*it).y = height;// y - because circle made in oXZ.
				vlist.push_back(*it);
			}
		}// if(top)

		if(bottom)
		{
			for(std::vector<aiVector3D>::iterator it = tcir.begin(); it != tcir.end(); ++it)
			{
				(*it).y = -height;// y - because circle made in oXZ.
				vlist.push_back(*it);
			}
		}// if(top)

		((CX3DImporter_NodeElement_Geometry3D*)ne)->Solid = solid;
		((CX3DImporter_NodeElement_Geometry3D*)ne)->NumIndices = 3;
		// check for X3DMetadataObject childs.
		if(!mReader->isEmptyElement())
			ParseNode_Metadata(ne, "Cylinder");
		else
			NodeElement_Cur->Child.push_back(ne);// add made object as child to current element

		NodeElement_List.push_back(ne);// add element to node element list because its a new object in graph
	}// if(!use.empty()) else
}